

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O2

Quadratic * parseOptions(Quadratic *__return_storage_ptr__,HighsLp *lp,ICrashOptions *options)

{
  HighsLp ilp;
  HighsLp local_lp;
  ICrashOptions IStack_b58;
  HighsLp local_ad8;
  HighsLp local_740;
  HighsLp local_3a8;
  
  HighsLp::HighsLp(&local_ad8,lp);
  HighsLp::HighsLp(&local_3a8);
  convertToMinimization(&local_ad8);
  isEqualityProblem(&local_ad8);
  HighsLp::HighsLp(&local_740,&local_ad8);
  ICrashOptions::ICrashOptions(&IStack_b58,options);
  Quadratic::Quadratic(__return_storage_ptr__,&local_740,&IStack_b58);
  std::_Function_base::~_Function_base(&IStack_b58.log_options.user_callback.super__Function_base);
  HighsLp::~HighsLp(&local_740);
  HighsLp::~HighsLp(&local_3a8);
  HighsLp::~HighsLp(&local_ad8);
  return __return_storage_ptr__;
}

Assistant:

Quadratic parseOptions(const HighsLp& lp, const ICrashOptions options) {
  HighsLp ilp = lp;
  HighsLp local_lp;
  // HighsStatus status;
  convertToMinimization(ilp);
  if (isEqualityProblem(ilp)) {
    if (options.dualize) {
      // status = dualizeEqualityProblem(ilp, local_lp);
      // if (status == HighsStatus::kOk) {
      //   ilp = local_lp;
      // } else {
      //   printf("Cannot dualize equality problem\n");
      // }
    }
  } else {
    // not equality problem.
    // assert(!options.breakpoints);  // remove when implementing breakpoints
    // and
    //                                // add if else.
    // status = transformIntoEqualityProblem(ilp, local_lp);
    // if (status == HighsStatus::kOk) {
    //   ilp = local_lp;
    // } else {
    //   printf("Cannot transform into equality problem\n");
    // }
    // if (options.dualize) {
    //   // Add slacks & dualize.
    //   // dualizeEqualityProblem returns a minimization equality problem.
    //   // status = dualizeEqualityProblem(ilp, local_lp);
    //   // if (status == HighsStatus::kOk) {
    //   //   ilp = local_lp;
    //   // } else {
    //   //   printf("Cannot dualize equality problem\n");
    //   // }
    // }
  }

  return Quadratic{ilp, options};
}